

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cTextureGatherTests.cpp
# Opt level: O2

long __thiscall gl4cts::anon_unknown_0::GatherTesselationShader::Run(GatherTesselationShader *this)

{
  CallLogWrapper *this_00;
  char *src_vs;
  bool bVar1;
  int iVar2;
  GLuint GVar3;
  Vec4 *epsilon;
  bool *compile_error;
  long lVar4;
  GLenum drawBuffer;
  Vec4 data;
  undefined1 local_b8 [32];
  char *local_98 [4];
  char *local_78 [4];
  GLfloat colorf [4];
  Vec4 buffData;
  
  iVar2 = (*(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper
            [0x24])();
  if ((char)iVar2 == '\0') {
    lVar4 = 0;
  }
  else {
    (*(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x1d])
              (this);
    this_00 = &(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper.
               super_CallLogWrapper;
    glu::CallLogWrapper::glGenFramebuffers(this_00,1,&(this->super_GatherBase).fbo);
    glu::CallLogWrapper::glGenRenderbuffers(this_00,1,&(this->super_GatherBase).rbo);
    glu::CallLogWrapper::glBindRenderbuffer(this_00,0x8d41,(this->super_GatherBase).rbo);
    (*(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x1e])
              (this);
    glu::CallLogWrapper::glBindFramebuffer(this_00,0x8d40,(this->super_GatherBase).fbo);
    glu::CallLogWrapper::glFramebufferRenderbuffer
              (this_00,0x8d40,0x8ce0,0x8d41,(this->super_GatherBase).rbo);
    drawBuffer = 0x8ce0;
    glu::CallLogWrapper::glDrawBuffers(this_00,1,&drawBuffer);
    colorf[0] = 0.0;
    colorf[1] = 0.0;
    colorf[2] = 0.0;
    colorf[3] = 0.0;
    glu::CallLogWrapper::glClearBufferfv(this_00,0x1800,0,colorf);
    glu::CallLogWrapper::glViewport(this_00,0,0,1,1);
    glu::CallLogWrapper::glGenVertexArrays(this_00,1,&(this->super_GatherBase).vao);
    glu::CallLogWrapper::glBindVertexArray(this_00,(this->super_GatherBase).vao);
    glu::CallLogWrapper::glGenBuffers(this_00,1,&(this->super_GatherBase).vbo);
    glu::CallLogWrapper::glBindBuffer(this_00,0x8892,(this->super_GatherBase).vbo);
    glu::CallLogWrapper::glVertexAttribPointer(this_00,0,4,0x1406,'\0',0,(void *)0x0);
    glu::CallLogWrapper::glEnableVertexAttribArray(this_00,0);
    (*(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x23])
              (&buffData,this);
    glu::CallLogWrapper::glBufferData(this_00,0x8892,0x10,&buffData,0x88e4);
    (*(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x1a])
              (&data,this);
    src_vs = (char *)CONCAT44(data.m_data[1],data.m_data[0]);
    (*(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x27])
              (local_b8,this);
    (*(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x28])
              (local_78,this);
    (*(this->super_GatherBase).super_TGBase.super_SubcaseBase.super_GLWrapper._vptr_GLWrapper[0x1b])
              (local_98,this);
    GVar3 = TGBase::CreateProgram
                      ((TGBase *)this,src_vs,(char *)local_b8._0_8_,local_78[0],(char *)0x0,
                       local_98[0]);
    (this->super_GatherBase).program = GVar3;
    std::__cxx11::string::~string((string *)local_98);
    std::__cxx11::string::~string((string *)local_78);
    std::__cxx11::string::~string((string *)local_b8);
    std::__cxx11::string::~string((string *)&data);
    glu::CallLogWrapper::glBindAttribLocation(this_00,(this->super_GatherBase).program,0,"v_in_0");
    glu::CallLogWrapper::glBindFragDataLocation
              (this_00,(this->super_GatherBase).program,0,"f_out_0");
    glu::CallLogWrapper::glLinkProgram(this_00,(this->super_GatherBase).program);
    bVar1 = TGBase::CheckProgram((TGBase *)this,(this->super_GatherBase).program,compile_error);
    if (bVar1) {
      glu::CallLogWrapper::glUseProgram(this_00,(this->super_GatherBase).program);
      glu::CallLogWrapper::glPatchParameteri(this_00,0x8e72,1);
      glu::CallLogWrapper::glDrawArrays(this_00,0xe,0,1);
      glu::CallLogWrapper::glReadBuffer(this_00,0x8ce0);
      glu::CallLogWrapper::glDeleteProgram(this_00,(this->super_GatherBase).program);
      tcu::Vector<float,_4>::Vector((Vector<float,_4> *)&data);
      epsilon = (Vec4 *)&DAT_00000001;
      glu::CallLogWrapper::glReadPixels(this_00,0,0,1,1,0x1908,0x1406,(TGBase *)&data);
      local_b8._0_8_ = (Context *)0x3f80000000000000;
      local_b8._8_8_ = (RenderTarget *)0x3f80000000000000;
      bVar1 = TGBase::ColorEqual((TGBase *)&data,(Vec4 *)local_b8,
                                 &(this->super_GatherBase).super_TGBase.g_color_eps,epsilon);
      if (bVar1) {
        return 0;
      }
      anon_unknown_0::Output
                ("Expected Vec4(0, 1, 0, 1), got: %f, %f, %f, %f, epsilon: %f, %f, %f, %f",
                 SUB84((double)data.m_data[0],0),(double)data.m_data[1],(double)data.m_data[2],
                 (double)data.m_data[3],
                 (double)(this->super_GatherBase).super_TGBase.g_color_eps.m_data[0],
                 (double)(this->super_GatherBase).super_TGBase.g_color_eps.m_data[1],
                 (double)(this->super_GatherBase).super_TGBase.g_color_eps.m_data[2],
                 (double)(this->super_GatherBase).super_TGBase.g_color_eps.m_data[3]);
    }
    lVar4 = -1;
  }
  return lVar4;
}

Assistant:

virtual long Run()
	{

		if (!Supported())
			return NO_ERROR;
		Init();

		glGenFramebuffers(1, &fbo);
		glGenRenderbuffers(1, &rbo);
		glBindRenderbuffer(GL_RENDERBUFFER, rbo);
		SetRbo();
		glBindFramebuffer(GL_FRAMEBUFFER, fbo);
		glFramebufferRenderbuffer(GL_FRAMEBUFFER, GL_COLOR_ATTACHMENT0, GL_RENDERBUFFER, rbo);
		GLenum drawBuffer = GL_COLOR_ATTACHMENT0;
		glDrawBuffers(1, &drawBuffer);
		GLfloat colorf[4] = { 0, 0, 0, 0 };
		glClearBufferfv(GL_COLOR, 0, colorf);
		glViewport(0, 0, 1, 1);

		glGenVertexArrays(1, &vao);
		glBindVertexArray(vao);
		glGenBuffers(1, &vbo);
		glBindBuffer(GL_ARRAY_BUFFER, vbo);
		glVertexAttribPointer(0, 4, GL_FLOAT, false, 0, 0);
		glEnableVertexAttribArray(0);
		Vec4 buffData = BufferData();
		glBufferData(GL_ARRAY_BUFFER, 16, &buffData, GL_STATIC_DRAW);

		program = CreateProgram(VertexShader().c_str(), ControlShader().c_str(), EvalShader().c_str(), NULL,
								FragmentShader().c_str());
		glBindAttribLocation(program, 0, "v_in_0");
		glBindFragDataLocation(program, 0, "f_out_0");
		glLinkProgram(program);
		if (!CheckProgram(program))
			return ERROR;
		glUseProgram(program);

		glPatchParameteri(GL_PATCH_VERTICES, 1);
		glDrawArrays(GL_PATCHES, 0, 1);
		glReadBuffer(GL_COLOR_ATTACHMENT0);

		glDeleteProgram(program);
		Vec4 data;
		glReadPixels(0, 0, 1, 1, GL_RGBA, GL_FLOAT, &data);
		if (!ColorEqual(data, Vec4(0, 1, 0, 1), g_color_eps))
		{
			Output("Expected Vec4(0, 1, 0, 1), got: %f, %f, %f, %f, epsilon: %f, %f, %f, %f", data.x(), data.y(),
				   data.z(), data.w(), g_color_eps.x(), g_color_eps.y(), g_color_eps.z(), g_color_eps.w());
			return ERROR;
		}
		return NO_ERROR;
	}